

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O1

_Bool tval_is_edible(object *obj)

{
  return (obj->tval & 0xfe) == 0x1c;
}

Assistant:

bool tval_is_edible(const struct object *obj)
{
	switch (obj->tval) {
		case TV_FOOD:
		case TV_MUSHROOM:
			return true;
		default:
			return false;
	}
}